

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O2

uint32_t utf8::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        end)

{
  char cVar1;
  utf_error uVar2;
  undefined8 *puVar3;
  pointer_____offset_0x10___ *ppuVar4;
  uint32_t cp;
  
  cp = 0;
  uVar2 = internal::validate_next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (it,end,&cp);
  if (uVar2 - INVALID_LEAD < 3) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    cVar1 = *it->_M_current;
    *puVar3 = &PTR__exception_00115c08;
    *(char *)(puVar3 + 1) = cVar1;
    ppuVar4 = &invalid_utf8::typeinfo;
  }
  else if (uVar2 == INVALID_CODE_POINT) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar3 = &PTR__exception_00115c30;
    *(uint32_t *)(puVar3 + 1) = cp;
    ppuVar4 = &invalid_code_point::typeinfo;
  }
  else {
    if (uVar2 != NOT_ENOUGH_ROOM) {
      return cp;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_00115be0;
    ppuVar4 = &not_enough_room::typeinfo;
  }
  __cxa_throw(puVar3,ppuVar4,std::exception::~exception);
}

Assistant:

uint32_t next(octet_iterator& it, octet_iterator end)
    {
        uint32_t cp = 0;
        internal::utf_error err_code = utf8::internal::validate_next(it, end, cp);
        switch (err_code) {
            case internal::UTF8_OK :
                break;
            case internal::NOT_ENOUGH_ROOM :
                throw not_enough_room();
            case internal::INVALID_LEAD :
            case internal::INCOMPLETE_SEQUENCE :
            case internal::OVERLONG_SEQUENCE :
                throw invalid_utf8(*it);
            case internal::INVALID_CODE_POINT :
                throw invalid_code_point(cp);
        }
        return cp;
    }